

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

function __thiscall
pybind11::get_type_overload(pybind11 *this,void *this_ptr,type_info *this_type,char *name)

{
  int iVar1;
  PyTypeObject *pPVar2;
  long lVar3;
  bool bVar4;
  handle obj;
  internals *piVar5;
  iterator iVar6;
  long lVar7;
  PyObject *pPVar8;
  object local_60;
  handle local_58;
  string local_50;
  
  obj = detail::get_object_handle(this_ptr,this_type);
  if (obj.m_ptr == (PyObject *)0x0) {
LAB_0014b120:
    *(undefined8 *)this = 0;
    return (object)(object)this;
  }
  pPVar2 = (obj.m_ptr)->ob_type;
  piVar5 = detail::get_internals();
  local_50._M_dataplus._M_p = (pointer)pPVar2;
  local_50._M_string_length = (size_type)name;
  iVar6 = std::
          _Hashtable<std::pair<const__object_*,_const_char_*>,_std::pair<const__object_*,_const_char_*>,_std::allocator<std::pair<const__object_*,_const_char_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_pybind11::detail::overload_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(piVar5->inactive_overload_cache)._M_h,(key_type *)&local_50);
  if (iVar6.super__Node_iterator_base<std::pair<const__object_*,_const_char_*>,_true>._M_cur !=
      (__node_type *)0x0) goto LAB_0014b120;
  local_60.super_handle.m_ptr = (handle)(PyObject *)0x0;
  getattr((pybind11 *)&local_50,obj,name,(handle)0x0);
  local_58.m_ptr = (PyObject *)local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  object::~object((object *)&local_50);
  object::~object(&local_60);
  bVar4 = function::is_cpp_function((function *)&local_58);
  if (bVar4) {
    local_50._M_dataplus._M_p = (pointer)pPVar2;
    local_50._M_string_length = (size_type)name;
    std::__detail::
    _Insert<std::pair<const__object_*,_const_char_*>,_std::pair<const__object_*,_const_char_*>,_std::allocator<std::pair<const__object_*,_const_char_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_pybind11::detail::overload_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::pair<const__object_*,_const_char_*>,_std::pair<const__object_*,_const_char_*>,_std::allocator<std::pair<const__object_*,_const_char_*>_>,_std::__detail::_Identity,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_pybind11::detail::overload_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&piVar5->inactive_overload_cache,(value_type *)&local_50);
LAB_0014b185:
    *(undefined8 *)this = 0;
  }
  else {
    lVar7 = PyThreadState_Get();
    lVar7 = *(long *)(lVar7 + 0x18);
    if (lVar7 != 0) {
      local_60.super_handle.m_ptr =
           (handle)PyObject_Str(*(undefined8 *)(*(long *)(lVar7 + 0x20) + 0x70));
      str::operator_cast_to_string(&local_50,(str *)&local_60);
      bVar4 = std::operator==(&local_50,name);
      if (bVar4) {
        iVar1 = *(int *)(*(long *)(lVar7 + 0x20) + 0x10);
        std::__cxx11::string::~string((string *)&local_50);
        object::~object(&local_60);
        if (0 < iVar1) {
          PyFrame_FastToLocals(lVar7);
          lVar3 = *(long *)(*(long *)(lVar7 + 0x20) + 0x48);
          if ((*(byte *)(*(long *)(lVar3 + 8) + 0xab) & 4) == 0) {
            __assert_fail("PyTuple_Check(frame->f_code->co_varnames)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/pybind11.h"
                          ,0x7ea,
                          "function pybind11::get_type_overload(const void *, const detail::type_info *, const char *)"
                         );
          }
          pPVar8 = (PyObject *)
                   PyDict_GetItem(*(undefined8 *)(lVar7 + 0x38),*(undefined8 *)(lVar3 + 0x18));
          if (pPVar8 == obj.m_ptr) goto LAB_0014b185;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_50);
        object::~object(&local_60);
      }
    }
    *(PyObject **)this = local_58.m_ptr;
    local_58.m_ptr = (PyObject *)0x0;
  }
  object::~object((object *)&local_58);
  return (object)(object)this;
}

Assistant:

inline function get_type_overload(const void *this_ptr, const detail::type_info *this_type, const char *name)  {
    handle self = detail::get_object_handle(this_ptr, this_type);
    if (!self)
        return function();
    handle type = self.get_type();
    auto key = std::make_pair(type.ptr(), name);

    /* Cache functions that aren't overloaded in Python to avoid
       many costly Python dictionary lookups below */
    auto &cache = detail::get_internals().inactive_overload_cache;
    if (cache.find(key) != cache.end())
        return function();

    function overload = getattr(self, name, function());
    if (overload.is_cpp_function()) {
        cache.insert(key);
        return function();
    }

    /* Don't call dispatch code if invoked from overridden function.
       Unfortunately this doesn't work on PyPy. */
#if !defined(PYPY_VERSION)
    PyFrameObject *frame = PyThreadState_Get()->frame;
    if (frame && (std::string) str(frame->f_code->co_name) == name &&
        frame->f_code->co_argcount > 0) {
        PyFrame_FastToLocals(frame);
        PyObject *self_caller = PyDict_GetItem(
            frame->f_locals, PyTuple_GET_ITEM(frame->f_code->co_varnames, 0));
        if (self_caller == self.ptr())
            return function();
    }
#else
    /* PyPy currently doesn't provide a detailed cpyext emulation of
       frame objects, so we have to emulate this using Python. This
       is going to be slow..*/
    dict d; d["self"] = self; d["name"] = pybind11::str(name);
    PyObject *result = PyRun_String(
        "import inspect\n"
        "frame = inspect.currentframe()\n"
        "if frame is not None:\n"
        "    frame = frame.f_back\n"
        "    if frame is not None and str(frame.f_code.co_name) == name and "
        "frame.f_code.co_argcount > 0:\n"
        "        self_caller = frame.f_locals[frame.f_code.co_varnames[0]]\n"
        "        if self_caller == self:\n"
        "            self = None\n",
        Py_file_input, d.ptr(), d.ptr());
    if (result == nullptr)
        throw error_already_set();
    if (d["self"].is_none())
        return function();
    Py_DECREF(result);
#endif

    return overload;
}